

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O2

void __thiscall
QAccessibleTable::modelChange(QAccessibleTable *this,QAccessibleTableModelChangeEvent *event)

{
  ChildCache *this_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Data *pDVar6;
  Span *pSVar7;
  char cVar8;
  int iVar9;
  int iVar10;
  long *plVar11;
  long lVar12;
  ulong uVar13;
  QAccessibleTableHeaderCell *cell;
  add_const_t<QHash<int,_unsigned_int>_> *__range2;
  long in_FS_OFFSET;
  int local_58;
  Id id;
  QHash<int,_unsigned_int> local_50;
  piter local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar6 = (this->childToId).d;
  if ((pDVar6 != (Data *)0x0) && (pDVar6->size != 0)) {
    this_00 = &this->childToId;
    iVar1 = *(int *)(event + 0x1c);
    if (iVar1 - 2U < 2) {
      iVar1 = *(int *)(event + 0x28);
      iVar4 = *(int *)(event + 0x2c);
      iVar9 = *(int *)(event + 0x24);
      iVar5 = *(int *)(event + 0x20);
      local_50.d = (Data *)0x0;
      local_48 = (piter)QHash<int,_unsigned_int>::constBegin(this_00);
      while( true ) {
        if (local_48.d == (Data<QHashPrivate::Node<int,_unsigned_int>_> *)0x0 &&
            local_48.bucket == 0) break;
        pSVar7 = (local_48.d)->spans;
        uVar13 = local_48.bucket >> 7;
        id = *(Id *)(pSVar7[uVar13].entries[pSVar7[uVar13].offsets[(uint)local_48.bucket & 0x7f]].
                     storage.data + 4);
        plVar11 = (long *)QAccessible::accessibleInterface(id);
        iVar10 = *(int *)(event + 0x1c);
        if (iVar10 == 2) {
          iVar10 = (**(code **)(*plVar11 + 0x78))(plVar11);
          if (iVar10 != 0x1a) {
            iVar10 = *(int *)(event + 0x1c);
            goto LAB_004dbb04;
          }
          if (*(int *)(event + 0x20) <= (int)plVar11[3]) {
            iVar10 = (int)plVar11[3] + (iVar1 - iVar5) + 1;
LAB_004dbb23:
            *(int *)(plVar11 + 3) = iVar10;
          }
        }
        else {
LAB_004dbb04:
          if (iVar10 == 3) {
            iVar10 = (**(code **)(*plVar11 + 0x78))(plVar11);
            if ((iVar10 == 0x19) && (*(int *)(event + 0x24) <= (int)plVar11[3])) {
              iVar10 = (int)plVar11[3] + (iVar4 - iVar9) + 1;
              goto LAB_004dbb23;
            }
          }
        }
        iVar10 = (**(code **)(*(long *)this + 0xf0))(this,plVar11);
        if (iVar10 < 0) {
          QAccessible::deleteAccessibleInterface(id);
        }
        else {
          local_58 = (**(code **)(*(long *)this + 0xf0))(this,plVar11);
          QHash<int,unsigned_int>::emplace<unsigned_int_const&>
                    ((QHash<int,unsigned_int> *)&local_50,&local_58,&id);
        }
        QHashPrivate::iterator<QHashPrivate::Node<int,_unsigned_int>_>::operator++(&local_48);
      }
    }
    else {
      if (1 < iVar1 - 4U) {
        if (iVar1 == 0) {
          local_48 = (piter)QHash<int,_unsigned_int>::begin(this_00);
          while( true ) {
            if (local_48.d == (Data<QHashPrivate::Node<int,_unsigned_int>_> *)0x0 &&
                local_48.bucket == 0) break;
            pSVar7 = (local_48.d)->spans;
            uVar13 = local_48.bucket >> 7;
            QAccessible::deleteAccessibleInterface
                      (*(uint *)(pSVar7[uVar13].entries
                                 [pSVar7[uVar13].offsets[(uint)local_48.bucket & 0x7f]].storage.data
                                + 4));
            QHashPrivate::iterator<QHashPrivate::Node<int,_unsigned_int>_>::operator++(&local_48);
          }
          QHash<int,_unsigned_int>::clear(this_00);
        }
        goto LAB_004dbb98;
      }
      uVar2 = *(uint *)(event + 0x2c);
      iVar1 = *(int *)(event + 0x24);
      uVar3 = *(uint *)(event + 0x28);
      iVar4 = *(int *)(event + 0x20);
      local_50.d = (Data *)0x0;
      local_48 = (piter)QHash<int,_unsigned_int>::constBegin(this_00);
      while( true ) {
        if (local_48.d == (Data<QHashPrivate::Node<int,_unsigned_int>_> *)0x0 &&
            local_48.bucket == 0) break;
        pSVar7 = (local_48.d)->spans;
        uVar13 = local_48.bucket >> 7;
        id = *(Id *)(pSVar7[uVar13].entries[pSVar7[uVar13].offsets[(uint)local_48.bucket & 0x7f]].
                     storage.data + 4);
        plVar11 = (long *)QAccessible::accessibleInterface(id);
        iVar9 = (**(code **)(*plVar11 + 0x78))(plVar11);
        if (iVar9 == 0x1d) {
LAB_004db982:
          lVar12 = (**(code **)(*plVar11 + 0xa0))(plVar11,6);
          plVar11 = (long *)(lVar12 + -8);
          if (lVar12 == 0) {
            plVar11 = (long *)0x0;
          }
          cVar8 = QPersistentModelIndex::isValid();
          if (cVar8 == '\0') {
LAB_004dba30:
            QAccessible::deleteAccessibleInterface(id);
          }
          else {
LAB_004db9ac:
            local_58 = (**(code **)(*(long *)this + 0xf0))(this,plVar11);
            QHash<int,unsigned_int>::emplace<unsigned_int_const&>
                      ((QHash<int,unsigned_int> *)&local_50,&local_58,&id);
          }
        }
        else {
          iVar9 = (**(code **)(*plVar11 + 0x78))(plVar11);
          if (iVar9 == 0x22) goto LAB_004db982;
          iVar9 = *(int *)(event + 0x1c);
          if (iVar9 == 4) {
            iVar9 = (**(code **)(*plVar11 + 0x78))(plVar11);
            if (iVar9 != 0x1a) {
              iVar9 = *(int *)(event + 0x1c);
              goto LAB_004dba03;
            }
            iVar9 = (int)plVar11[3];
            if (*(int *)(event + 0x20) <= iVar9) {
              if (*(int *)(event + 0x28) < iVar9) {
                iVar9 = iVar9 + ~uVar3 + iVar4;
LAB_004dba28:
                *(int *)(plVar11 + 3) = iVar9;
                goto LAB_004db9ac;
              }
              goto LAB_004dba30;
            }
            goto LAB_004db9ac;
          }
LAB_004dba03:
          if (iVar9 == 5) {
            iVar9 = (**(code **)(*plVar11 + 0x78))(plVar11);
            if (iVar9 == 0x19) {
              iVar9 = (int)plVar11[3];
              if (*(int *)(event + 0x24) <= iVar9) {
                if (*(int *)(event + 0x2c) < iVar9) {
                  iVar9 = iVar9 + ~uVar2 + iVar1;
                  goto LAB_004dba28;
                }
                goto LAB_004dba30;
              }
              goto LAB_004db9ac;
            }
          }
        }
        QHashPrivate::iterator<QHashPrivate::Node<int,_unsigned_int>_>::operator++(&local_48);
      }
    }
    QHash<int,_unsigned_int>::operator=(this_00,&local_50);
    QHash<int,_unsigned_int>::~QHash(&local_50);
  }
LAB_004dbb98:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAccessibleTable::modelChange(QAccessibleTableModelChangeEvent *event)
{
    // if there is no cache yet, we don't update anything
    if (childToId.isEmpty())
        return;

    switch (event->modelChangeType()) {
    case QAccessibleTableModelChangeEvent::ModelReset:
        for (QAccessible::Id id : std::as_const(childToId))
            QAccessible::deleteAccessibleInterface(id);
        childToId.clear();
        break;

    // rows are inserted: move every row after that
    case QAccessibleTableModelChangeEvent::RowsInserted:
    case QAccessibleTableModelChangeEvent::ColumnsInserted: {
        int newRows = event->lastRow() - event->firstRow() + 1;
        int newColumns = event->lastColumn() - event->firstColumn() + 1;

        ChildCache newCache;
        ChildCache::ConstIterator iter = childToId.constBegin();

        while (iter != childToId.constEnd()) {
            QAccessible::Id id = iter.value();
            QAccessibleInterface *iface = QAccessible::accessibleInterface(id);
            Q_ASSERT(iface);
            if (event->modelChangeType() == QAccessibleTableModelChangeEvent::RowsInserted
                && iface->role() == QAccessible::RowHeader) {
                QAccessibleTableHeaderCell *cell = static_cast<QAccessibleTableHeaderCell*>(iface);
                if (cell->index >= event->firstRow()) {
                    cell->index += newRows;
                }
            } else if (event->modelChangeType() == QAccessibleTableModelChangeEvent::ColumnsInserted
                   && iface->role() == QAccessible::ColumnHeader) {
                QAccessibleTableHeaderCell *cell = static_cast<QAccessibleTableHeaderCell*>(iface);
                if (cell->index >= event->firstColumn()) {
                    cell->index += newColumns;
                }
            }
            if (indexOfChild(iface) >= 0) {
                newCache.insert(indexOfChild(iface), id);
            } else {
                // ### This should really not happen,
                // but it might if the view has a root index set.
                // This needs to be fixed.
                QAccessible::deleteAccessibleInterface(id);
            }
            ++iter;
        }
        childToId = newCache;
        break;
    }

    case QAccessibleTableModelChangeEvent::ColumnsRemoved:
    case QAccessibleTableModelChangeEvent::RowsRemoved: {
        int deletedColumns = event->lastColumn() - event->firstColumn() + 1;
        int deletedRows = event->lastRow() - event->firstRow() + 1;
        ChildCache newCache;
        ChildCache::ConstIterator iter = childToId.constBegin();
        while (iter != childToId.constEnd()) {
            QAccessible::Id id = iter.value();
            QAccessibleInterface *iface = QAccessible::accessibleInterface(id);
            Q_ASSERT(iface);
            if (iface->role() == QAccessible::Cell || iface->role() == QAccessible::ListItem) {
                Q_ASSERT(iface->tableCellInterface());
                QAccessibleTableCell *cell = static_cast<QAccessibleTableCell*>(iface->tableCellInterface());
                // Since it is a QPersistentModelIndex, we only need to check if it is valid
                if (cell->m_index.isValid())
                    newCache.insert(indexOfChild(cell), id);
                else
                    QAccessible::deleteAccessibleInterface(id);
            } else if (event->modelChangeType() == QAccessibleTableModelChangeEvent::RowsRemoved
                       && iface->role() == QAccessible::RowHeader) {
                QAccessibleTableHeaderCell *cell = static_cast<QAccessibleTableHeaderCell*>(iface);
                if (cell->index < event->firstRow()) {
                    newCache.insert(indexOfChild(cell), id);
                } else if (cell->index > event->lastRow()) {
                    cell->index -= deletedRows;
                    newCache.insert(indexOfChild(cell), id);
                } else {
                    QAccessible::deleteAccessibleInterface(id);
                }
            } else if (event->modelChangeType() == QAccessibleTableModelChangeEvent::ColumnsRemoved
                   && iface->role() == QAccessible::ColumnHeader) {
                QAccessibleTableHeaderCell *cell = static_cast<QAccessibleTableHeaderCell*>(iface);
                if (cell->index < event->firstColumn()) {
                    newCache.insert(indexOfChild(cell), id);
                } else if (cell->index > event->lastColumn()) {
                    cell->index -= deletedColumns;
                    newCache.insert(indexOfChild(cell), id);
                } else {
                    QAccessible::deleteAccessibleInterface(id);
                }
            }
            ++iter;
        }
        childToId = newCache;
        break;
    }

    case QAccessibleTableModelChangeEvent::DataChanged:
        // nothing to do in this case
        break;
    }
}